

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap_str.c
# Opt level: O3

char * ap_str_shrink_spaces(char *str)

{
  char *__s;
  char *__s_00;
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  
  __s_00 = ap_str_find_first_char_from_set(str,"\t ");
  if (__s_00 != (char *)0x0) {
    sVar1 = strlen(str);
    pcVar3 = str;
    do {
      sVar2 = strspn(__s_00,"\t ");
      if (sVar2 < 2) {
        return str;
      }
      __s = __s_00 + 1;
      memmove(__s,__s_00 + sVar2,(size_t)(pcVar3 + (sVar1 - (long)(__s_00 + sVar2)) + 1));
      sVar1 = strlen(__s);
      __s_00 = ap_str_find_first_char_from_set(__s,"\t ");
      pcVar3 = __s;
    } while (__s_00 != (char *)0x0);
  }
  return str;
}

Assistant:

char * ap_str_shrink_spaces (char *str)
{
	size_t seg_len = 0;
	size_t str_len = strlen (str);

	char *pos = ap_str_find_first_char_from_set (str, "\t ");
	if (pos == NULL)
	{
		goto finish;
	}

	seg_len = strspn (pos, "\t ");
	if (seg_len > 1)
	{
		memmove (pos + 1, pos + seg_len, str_len + str - pos - seg_len + 1);

		ap_str_shrink_spaces (pos + 1);
	}

finish:
	return str;
}